

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

void __thiscall Client::handleLogoutRequest(Client *this,LogoutRequest *request)

{
  User *pUVar1;
  size_t __n;
  CommunicationStack *pCVar2;
  pointer pcVar3;
  int iVar4;
  json_value *this_00;
  Event EVar5;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  undefined1 local_20 [16];
  
  pUVar1 = this->user;
  if (pUVar1 == (User *)0x0) {
    pCVar2 = this->communicationStack;
    EVar5 = LogoutResponse::operator_cast_to_basic_json((LogoutResponse *)(local_40 + 0x20));
    (*(pCVar2->super_IONotifiable)._vptr_IONotifiable[3])
              (pCVar2,(LogoutResponse *)(local_40 + 0x20),EVar5.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)(local_40 + 0x20));
    this_00 = (json_value *)(local_40 + 0x28);
    goto LAB_00112032;
  }
  __n = (pUVar1->username)._M_string_length;
  if (__n == (request->username)._M_string_length) {
    if (__n != 0) {
      iVar4 = bcmp((pUVar1->username)._M_dataplus._M_p,(request->username)._M_dataplus._M_p,__n);
      if (iVar4 != 0) goto LAB_00111f34;
    }
    pcVar3 = (pUVar1->password)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(pUVar1->password).field_2) {
      operator_delete(pcVar3);
    }
    pcVar3 = (pUVar1->bio)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(pUVar1->bio).field_2) {
      operator_delete(pcVar3);
    }
    pcVar3 = (pUVar1->alias)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(pUVar1->alias).field_2) {
      operator_delete(pcVar3);
    }
    pcVar3 = (pUVar1->username)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &(pUVar1->username).field_2) {
      operator_delete(pcVar3);
    }
    operator_delete(pUVar1);
    this->user = (User *)0x0;
    pCVar2 = this->communicationStack;
    EVar5 = LogoutResponse::operator_cast_to_basic_json((LogoutResponse *)(local_40 + 0x10));
    (*(pCVar2->super_IONotifiable)._vptr_IONotifiable[3])
              (pCVar2,(LogoutResponse *)(local_40 + 0x10),EVar5.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)(local_40 + 0x10));
    this_00 = (json_value *)(local_40 + 0x18);
  }
  else {
LAB_00111f34:
    pCVar2 = this->communicationStack;
    EVar5 = LogoutResponse::operator_cast_to_basic_json((LogoutResponse *)local_40);
    (*(pCVar2->super_IONotifiable)._vptr_IONotifiable[3])
              (pCVar2,(LogoutResponse *)local_40,EVar5.m_value.object);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_40);
    this_00 = (json_value *)(local_40 + 8);
  }
LAB_00112032:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy(this_00,(value_t)this_00[-8]);
  return;
}

Assistant:

void Client::handleLogoutRequest(LogoutRequest request)
{
	if(user == nullptr)
	{
		communicationStack->sendEvent(LogoutResponse(false));
		return;
	}

	if(user->getUsername() == request.username)
	{
		delete user;
		user = nullptr;
		communicationStack->sendEvent(LogoutResponse(true));
	}
	else
	{
		communicationStack->sendEvent(LogoutResponse(false));
	}
}